

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::SamOverlap::SamOverlap
          (SamOverlap *this,char *q_name,uint32_t q_name_len,uint32_t flag,char *t_name,
          uint32_t t_name_len,uint32_t t_begin,uint32_t map_quality,char *cigar,uint32_t cigar_len,
          char *t_next_name,uint32_t t_next_name_len,uint32_t t_next_begin,uint32_t template_len,
          char *data,uint32_t data_len,char *quality,uint32_t quality_len)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d [16];
  allocator local_2d;
  uint32_t local_2c;
  char *pcStack_28;
  uint32_t t_name_len_local;
  char *t_name_local;
  uint32_t flag_local;
  uint32_t q_name_len_local;
  char *q_name_local;
  SamOverlap *this_local;
  
  local_2c = t_name_len;
  pcStack_28 = t_name;
  t_name_local._0_4_ = flag;
  t_name_local._4_4_ = q_name_len;
  _flag_local = q_name;
  q_name_local = (char *)this;
  biosoup::Overlap::Overlap(&this->super_Overlap,0,0,0,0,t_begin,0,0,cigar,cigar_len,true);
  pcVar1 = _flag_local;
  uVar2 = (ulong)t_name_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->q_name,pcVar1,uVar2,&local_2d);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  pcVar1 = pcStack_28;
  this->flag = (uint32_t)t_name_local;
  uVar2 = (ulong)local_2c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->t_name,pcVar1,uVar2,local_3d);
  std::allocator<char>::~allocator((allocator<char> *)local_3d);
  this->map_quality = map_quality;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&this->t_next_name,t_next_name,(ulong)t_next_name_len,&local_3e);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e);
  this->t_next_begin = t_next_begin;
  this->template_len = template_len;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->data,data,(ulong)data_len,&local_3f);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->quality,quality,(ulong)quality_len,&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_40);
  return;
}

Assistant:

SamOverlap(
      const char* q_name, std::uint32_t q_name_len,
      std::uint32_t flag,
      const char* t_name, std::uint32_t t_name_len,
      std::uint32_t t_begin,
      std::uint32_t map_quality,
      const char* cigar, std::uint32_t cigar_len,
      const char* t_next_name, std::uint32_t t_next_name_len,
      std::uint32_t t_next_begin,
      std::uint32_t template_len,
      const char* data, std::uint32_t data_len,
      const char* quality, std::uint32_t quality_len)
      : biosoup::Overlap(
          0, 0, 0,
          0, t_begin, 0,
          0,
          cigar, cigar_len),
        q_name(q_name, q_name_len),
        flag(flag),
        t_name(t_name, t_name_len),
        map_quality(map_quality),
        t_next_name(t_next_name, t_next_name_len),
        t_next_begin(t_next_begin),
        template_len(template_len),
        data(data, data_len),
        quality(quality, quality_len) {}